

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O3

void __thiscall QSyntaxHighlighter::rehighlightBlock(QSyntaxHighlighter *this,QTextBlock *block)

{
  bool bVar1;
  QSyntaxHighlighterPrivate *this_00;
  Data *pDVar2;
  bool bVar3;
  int from;
  int iVar4;
  QObject *pQVar5;
  QObject *pQVar6;
  long in_FS_OFFSET;
  QTextCursor cursor;
  QTextCursor local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSyntaxHighlighterPrivate **)&this->field_0x8;
  pDVar2 = (this_00->doc).wp.d;
  if (((pDVar2 != (Data *)0x0) && ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i != 0))
     && ((this_00->doc).wp.value != (QObject *)0x0)) {
    bVar3 = QTextBlock::isValid(block);
    if (bVar3) {
      pQVar5 = &QTextBlock::document(block)->super_QObject;
      pDVar2 = (this_00->doc).wp.d;
      if ((pDVar2 == (Data *)0x0) ||
         ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
        pQVar6 = (QObject *)0x0;
      }
      else {
        pQVar6 = (this_00->doc).wp.value;
      }
      if (pQVar6 == pQVar5) {
        bVar3 = this_00->rehighlightPending;
        local_38.d.d.ptr = (QSharedDataPointer<QTextCursorPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        QTextCursor::QTextCursor(&local_38,block);
        bVar1 = this_00->inReformatBlocks;
        this_00->inReformatBlocks = true;
        QTextCursor::beginEditBlock(&local_38);
        from = QTextCursor::position(&local_38);
        QTextCursor::movePosition(&local_38,EndOfBlock,MoveAnchor,1);
        iVar4 = QTextCursor::position(&local_38);
        QSyntaxHighlighterPrivate::reformatBlocks(this_00,from,0,iVar4 - from);
        QTextCursor::endEditBlock(&local_38);
        this_00->inReformatBlocks = bVar1;
        if (bVar3 == true) {
          this_00->rehighlightPending = true;
        }
        QTextCursor::~QTextCursor(&local_38);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSyntaxHighlighter::rehighlightBlock(const QTextBlock &block)
{
    Q_D(QSyntaxHighlighter);
    if (!d->doc || !block.isValid() || block.document() != d->doc)
        return;

    const bool rehighlightPending = d->rehighlightPending;

    QTextCursor cursor(block);
    d->rehighlight(cursor, QTextCursor::EndOfBlock);

    if (rehighlightPending)
        d->rehighlightPending = rehighlightPending;
}